

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIDManifest.cpp
# Opt level: O1

string * anon_unknown.dwarf_18db4a::randomWord
                   (string *__return_storage_ptr__,bool alphaNumeric,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *options)

{
  pointer pbVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  pointer pcVar5;
  string *word;
  ulong uVar6;
  
  uVar6 = (long)(options->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(options->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (uVar6 == 0) {
    uVar4 = random_int(0x20);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)uVar4);
    if (0 < (int)uVar4) {
      uVar6 = 0;
      do {
        if (alphaNumeric) {
          iVar3 = random_int(0x3e);
          pcVar5 = (__return_storage_ptr__->_M_dataplus)._M_p;
          cVar2 = (char)iVar3;
          if (iVar3 < 0x1a) {
            cVar2 = cVar2 + 'A';
          }
          else if (iVar3 < 0x34) {
            cVar2 = cVar2 + 'G';
          }
          else {
            cVar2 = cVar2 + -4;
          }
        }
        else {
          iVar3 = random_int(0x100);
          cVar2 = (char)iVar3;
          pcVar5 = (__return_storage_ptr__->_M_dataplus)._M_p;
        }
        pcVar5[uVar6] = cVar2;
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
  }
  else {
    iVar3 = random_int((int)(uVar6 >> 5));
    pbVar1 = (options->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = pbVar1[iVar3]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar5,pcVar5 + pbVar1[iVar3]._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
randomWord (bool alphaNumeric, const std::vector<std::string>& options)
{
    if (options.size () > 0) { return options[random_int (options.size ())]; }
    else
    {
        int         length = random_int (32);
        std::string word (length, ' ');
        for (int l = 0; l < length; ++l)
        {
            if (alphaNumeric)
            {
                int index =
                    random_int (62); // 26 letters*2 for case + 10 digits
                if (index < 26) { word[l] = 'A' + index; }
                else if (index < 52) { word[l] = 'a' + (index - 26); }
                else { word[l] = '0' + (index - 52); }
            }
            else { word[l] = random_int (256); }
        }
        return word;
    }
}